

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O1

bool tinyexr::getCode(int po,int rlc,longlong *c,int *lc,char **in,char *in_end,unsigned_short **out
                     ,unsigned_short *ob,unsigned_short *oe)

{
  unsigned_short uVar1;
  int iVar2;
  byte *pbVar3;
  long lVar4;
  byte bVar5;
  ulong uVar6;
  unsigned_short *puVar7;
  
  if (po == rlc) {
    iVar2 = *lc;
    if (iVar2 < 8) {
      pbVar3 = (byte *)*in;
      if (in_end <= pbVar3) {
        return false;
      }
      lVar4 = *c;
      *in = (char *)(pbVar3 + 1);
      *c = (ulong)*pbVar3 | lVar4 << 8;
      *lc = iVar2 + 8;
    }
    iVar2 = *lc;
    *lc = iVar2 + -8;
    uVar6 = *c >> ((byte)(iVar2 + -8) & 0x3f);
    if ((*out + (uVar6 & 0xff) <= oe) && (puVar7 = *out + -1, ob <= puVar7)) {
      if ((char)uVar6 != '\0') {
        uVar1 = *puVar7;
        puVar7 = *out;
        do {
          *puVar7 = uVar1;
          puVar7 = puVar7 + 1;
          bVar5 = (char)uVar6 - 1;
          uVar6 = (ulong)bVar5;
        } while (bVar5 != 0);
        *out = puVar7;
      }
      return true;
    }
  }
  else {
    puVar7 = *out;
    if (puVar7 < oe) {
      *out = puVar7 + 1;
      *puVar7 = (unsigned_short)po;
      return true;
    }
  }
  return false;
}

Assistant:

static bool getCode(int po, int rlc, long long &c, int &lc, const char *&in,
                    const char *in_end, unsigned short *&out,
                    const unsigned short *ob, const unsigned short *oe) {
  (void)ob;
  if (po == rlc) {
    if (lc < 8) {
      /* TinyEXR issue 78 */
      /* TinyEXR issue 160. in + 1 -> in */
      if (in >= in_end) {
        return false;
      }

      getChar(c, lc, in);
    }

    lc -= 8;

    unsigned char cs = (c >> lc);

    if (out + cs > oe) return false;

    // Bounds check for safety
    // Issue 100.
    if ((out - 1) < ob) return false;
    unsigned short s = out[-1];

    while (cs-- > 0) *out++ = s;
  } else if (out < oe) {
    *out++ = po;
  } else {
    return false;
  }
  return true;
}